

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O0

CopyCtrFn QtPrivate::QMetaTypeForType<QHash<QString,_QVariant>_>::getCopyCtr(void)

{
  _func_void_QMetaTypeInterface_ptr_void_ptr_void_ptr *p_Var1;
  long in_FS_OFFSET;
  _lambda_QtPrivate__QMetaTypeInterface_const__void__void_const___1_ local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var1 = QMetaTypeForType::getCopyCtr()::
           {lambda(QtPrivate::QMetaTypeInterface_const*,void*,void_const*)#1}::
           operator_cast_to_function_pointer(&local_9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return p_Var1;
  }
  __stack_chk_fail();
}

Assistant:

static constexpr QMetaTypeInterface::CopyCtrFn getCopyCtr()
    {
        if constexpr (std::is_copy_constructible_v<S> && !std::is_trivially_copy_constructible_v<S>) {
            return [](const QMetaTypeInterface *, void *addr, const void *other) {
                if constexpr (qxp::is_detected_v<QMetaTypeCopyTraits::HasDeprecatedCopyConstructorTest, S>) {
#if !defined(QT_BOOTSTRAPPED)
                    QMetaTypeCopyTraits::warnAboutDeprecatedCopy(getName());
#endif
                    QT_IGNORE_DEPRECATIONS(new (addr) S(*reinterpret_cast<const S *>(other));)
                } else {
                    new (addr) S(*reinterpret_cast<const S *>(other));
                }
            };
        } else {
            return nullptr;
        }
    }